

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&,_bool)> *work)

{
  undefined8 uVar1;
  Executor *unaff_R12;
  _Hash_node_base *p_Var2;
  Worker *unaff_R15;
  Runtime rt;
  undefined1 local_4a;
  undefined1 local_49;
  Executor *local_48;
  Worker *local_40;
  Node *local_38;
  char local_30;
  
  local_30 = '\0';
  local_48 = this;
  local_40 = worker;
  local_38 = node;
  if (((uint)node->_nstate >> 0x1d & 1) != 0) {
    node->_nstate = node->_nstate & 0xdfffffff;
    goto LAB_00109286;
  }
  for (p_Var2 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
  }
  local_4a = 0;
  unaff_R12 = this;
  if (*(long *)(work + 0x10) == 0) goto LAB_001092b7;
  (**(code **)(work + 0x18))(work,&local_48,&local_4a);
  while( true ) {
    for (p_Var2 = (unaff_R12->_observers)._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
    }
    unaff_R12 = (Executor *)0x0;
    unaff_R15 = worker;
    if (local_30 != '\0') break;
LAB_00109286:
    worker = unaff_R15;
    local_49 = 1;
    if (*(long *)(work + 0x10) != 0) {
      (**(code **)(work + 0x18))(work,&local_48,&local_49);
      return false;
    }
    std::__throw_bad_function_call();
LAB_001092b7:
    uVar1 = std::__throw_bad_function_call();
    __cxa_begin_catch(uVar1);
    _process_exception(unaff_R12,worker,node);
    __cxa_end_catch();
  }
  return true;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&, bool)>& work
) {
    
  Runtime rt(*this, worker, node);

  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt, false);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    // Ex: if preempted, another task may finish real quck and insert this parent task
    // again into the scheduling queue. When running this parent task, it will jump to
    // else branch below and modify tne nstate, thus incuring data race.
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }

  // clean up outstanding work
  work(rt, true);

  return false;
}